

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.hpp
# Opt level: O1

void __thiscall
gl4cts::EnhancedLayouts::VaryingComponentsTest::~VaryingComponentsTest(VaryingComponentsTest *this)

{
  pointer puVar1;
  pointer ptVar2;
  
  (this->super_VaryingLocationsTest).super_TextureTestBase.super_TestBase.super_TestCase.
  super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)&PTR__VaryingComponentsTest_0210b150;
  puVar1 = (this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->m_data).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  ptVar2 = (this->m_test_cases).
           super__Vector_base<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (ptVar2 != (pointer)0x0) {
    operator_delete(ptVar2,(long)(this->m_test_cases).
                                 super__Vector_base<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ptVar2);
  }
  VaryingLocationsTest::~VaryingLocationsTest(&this->super_VaryingLocationsTest);
  return;
}

Assistant:

~VaryingComponentsTest()
	{
	}